

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

bool google::protobuf::compiler::java::HasRepeatedFields(Descriptor *descriptor)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *this;
  FieldDescriptor *field;
  int i;
  Descriptor *descriptor_local;
  
  field._4_4_ = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(descriptor);
    if (iVar2 <= field._4_4_) {
      return false;
    }
    this = Descriptor::field(descriptor,field._4_4_);
    bVar1 = FieldDescriptor::is_repeated(this);
    if (bVar1) break;
    field._4_4_ = field._4_4_ + 1;
  }
  return true;
}

Assistant:

bool HasRepeatedFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->is_repeated()) {
      return true;
    }
  }
  return false;
}